

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

char * __thiscall anon_unknown.dwarf_1574b9::MMIFStream::readMemoryMapped(MMIFStream *this,int n)

{
  ulong uVar1;
  InputExc *this_00;
  
  uVar1 = this->_pos;
  if (uVar1 < this->_length) {
    if ((long)n + uVar1 <= this->_length) {
      this->_pos = (long)n + uVar1;
      return this->_mmapStart + uVar1;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(this_00,"Reading past end of file.");
  }
  else {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(this_00,"Unexpected end of file.");
  }
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

char*
MMIFStream::readMemoryMapped (int n)
{
    if (_pos >= _length)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    if (_pos + n > _length)
        throw IEX_NAMESPACE::InputExc ("Reading past end of file.");

    char* retVal = const_cast<char*>(_mmapStart) + _pos;
    _pos += n;
    return retVal;
}